

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O2

bool redit_create(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  uint vnum;
  AREA_DATA_conflict *pAVar2;
  char *pcVar3;
  ROOM_INDEX_DATA *pRVar4;
  char *pcVar5;
  char buf [4608];
  char acStack_1228 [4616];
  
  vnum = atoi(argument);
  if ((int)vnum < 1 || *argument == '\0') {
    pcVar5 = "Syntax:  create [vnum > 0]\n\r";
    goto LAB_003a0be8;
  }
  pAVar2 = get_vnum_area(vnum);
  if (pAVar2 == (AREA_DATA_conflict *)0x0) {
    pcVar5 = "REdit:  That vnum is not assigned an area.\n\r";
    goto LAB_003a0be8;
  }
  bVar1 = is_switched(ch);
  if (bVar1) {
LAB_003a0b7e:
    pcVar5 = "REdit:  Vnum in an area you cannot build in.\n\r";
  }
  else {
    if (ch->pcdata->security <= pAVar2->security) {
      pcVar5 = pAVar2->builders;
      pcVar3 = strstr(pcVar5,ch->name);
      if ((pcVar3 == (char *)0x0) && (pcVar5 = strstr(pcVar5,"All"), pcVar5 == (char *)0x0))
      goto LAB_003a0b7e;
    }
    pRVar4 = get_room_index(vnum);
    if (pRVar4 == (ROOM_INDEX_DATA *)0x0) {
      pRVar4 = new_room_index();
      pRVar4->area = pAVar2;
      pRVar4->vnum = (short)vnum;
      if (top_vnum_room < (int)vnum) {
        top_vnum_room = vnum;
      }
      pRVar4->next = room_index_hash[vnum & 0x3ff];
      room_index_hash[vnum & 0x3ff] = pRVar4;
      ch->desc->pEdit = pRVar4;
      sprintf(acStack_1228,"Room #%d created.\n\r",(ulong)vnum);
      send_to_char(acStack_1228,ch);
      return true;
    }
    pcVar5 = "REdit:  Room vnum already exists.\n\r";
  }
LAB_003a0be8:
  send_to_char(pcVar5,ch);
  return false;
}

Assistant:

bool redit_create(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;
	ROOM_INDEX_DATA *pRoom;
	int value;
	int iHash;
	char buf[MSL];

	EDIT_ROOM(ch, pRoom);

	value = atoi(argument);

	if (argument[0] == '\0' || value <= 0)
	{
		send_to_char("Syntax:  create [vnum > 0]\n\r", ch);
		return false;
	}

	pArea = get_vnum_area(value);

	if (!pArea)
	{
		send_to_char("REdit:  That vnum is not assigned an area.\n\r", ch);
		return false;
	}

	if (!IS_BUILDER(ch, pArea))
	{
		send_to_char("REdit:  Vnum in an area you cannot build in.\n\r", ch);
		return false;
	}

	if (get_room_index(value))
	{
		send_to_char("REdit:  Room vnum already exists.\n\r", ch);
		return false;
	}

	pRoom = new_room_index();
	pRoom->area = pArea;
	pRoom->vnum = value;

	if (value > top_vnum_room)
		top_vnum_room = value;

	iHash = value % MAX_KEY_HASH;
	pRoom->next = room_index_hash[iHash];
	room_index_hash[iHash] = pRoom;
	ch->desc->pEdit = (void *)pRoom;

	sprintf(buf, "Room #%d created.\n\r", value);
	send_to_char(buf, ch);
	return true;
}